

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::decimal_t,_1UL> *val)

{
  reference_type pbVar1;
  undefined8 uVar2;
  decimal_t v;
  optional_base<example::decimal_t> local_24;
  
  if ((this->opts_).super_type.m_initialized != false) {
    pbVar1 = boost::optional<std::bitset<16UL>_>::get(&this->opts_);
    if (((pbVar1->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      v._0_4_ = v._0_4_ & 0xffffff00;
      v.mantissa_ = 0;
      operator()(this,&v);
      local_24.m_storage.dummy_._4_4_ = v.mantissa_;
      local_24.m_storage.dummy_.aligner_ = (type)v._0_4_;
      local_24.m_initialized = true;
      boost::optional_detail::optional_base<example::decimal_t>::operator=
                ((optional_base<example::decimal_t> *)val,&local_24);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }